

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O0

void CBlockFileInfo::SerializationOps<DataStream,CBlockFileInfo_const,ActionSerialize>
               (undefined8 param_1,unsigned_long *param_2)

{
  long lVar1;
  long in_FS_OFFSET;
  DataStream *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int_const&>((uint *)param_2);
  ActionSerialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int_const&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> *)0x1111264);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int_const&>((uint *)param_2);
  ActionSerialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int_const&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> *)0x1111296);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int_const&>((uint *)param_2);
  ActionSerialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int_const&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> *)0x11112c2);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int_const&>((uint *)param_2);
  ActionSerialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int_const&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> *)0x11112ee);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int_const&>((uint *)param_2);
  ActionSerialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int_const&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_int_&> *)0x111131a);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_long_const&>(param_2);
  ActionSerialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_long_const&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_long_&> *)0x1111346);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_long_const&>(param_2);
  ActionSerialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_long_const&>>
            (in_stack_ffffffffffffff68,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_const_unsigned_long_&> *)0x1111372);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CBlockFileInfo, obj)
    {
        READWRITE(VARINT(obj.nBlocks));
        READWRITE(VARINT(obj.nSize));
        READWRITE(VARINT(obj.nUndoSize));
        READWRITE(VARINT(obj.nHeightFirst));
        READWRITE(VARINT(obj.nHeightLast));
        READWRITE(VARINT(obj.nTimeFirst));
        READWRITE(VARINT(obj.nTimeLast));
    }